

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.hpp
# Opt level: O0

difference_t type_safe::operator-(index_t *lhs,index_t *rhs)

{
  ulong uVar1;
  bool bVar2;
  ulong uVar3;
  ulong *puVar4;
  long *plVar5;
  integer<long,_type_safe::undefined_behavior_arithmetic> local_190;
  ulong local_178;
  ulong local_160;
  ulong local_150;
  ulong local_148;
  integer_type_conflict local_140;
  index_t *local_138;
  index_t *rhs_local;
  index_t *lhs_local;
  ulong local_120;
  ulong local_118;
  integer<unsigned_long,_type_safe::undefined_behavior_arithmetic> *local_110;
  undefined1 local_108 [8];
  integer<unsigned_long,_type_safe::undefined_behavior_arithmetic> *local_100;
  ulong local_f8;
  ulong local_f0;
  integer<unsigned_long,_type_safe::undefined_behavior_arithmetic> *local_e8;
  undefined1 local_e0 [8];
  integer<unsigned_long,_type_safe::undefined_behavior_arithmetic> *local_d8;
  ulong *local_d0;
  undefined1 *local_c8;
  ulong *local_c0;
  undefined1 *local_b8;
  char *local_b0;
  undefined4 local_a8;
  regular_void local_99;
  ulong *local_98;
  char *local_90;
  undefined4 local_88;
  regular_void local_79;
  ulong *local_78;
  integer_type_conflict local_70;
  ulong *local_68;
  ulong *local_60;
  undefined1 local_58 [8];
  ulong *local_50;
  ulong *local_48;
  integer_type_conflict *local_40;
  undefined1 *local_38;
  char *local_30;
  undefined4 local_28;
  regular_void local_19;
  ulong local_18;
  ulong local_10;
  
  local_138 = rhs;
  rhs_local = lhs;
  local_e8 = get<type_safe::index_t,type_safe::integer<unsigned_long,type_safe::undefined_behavior_arithmetic>>
                       (&lhs->
                         super_strong_typedef<type_safe::index_t,_type_safe::integer<unsigned_long,_type_safe::undefined_behavior_arithmetic>_>
                       );
  uVar1 = local_e8->value_;
  local_98 = &local_f8;
  local_f8 = uVar1;
  local_d8 = local_e8;
  uVar3 = std::numeric_limits<long>::max();
  if (uVar3 < uVar1) {
    local_b0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/include/type_safe/integer.hpp"
    ;
    local_a8 = 0x167;
    debug_assert::detail::
    do_assert<bool()noexcept,type_safe::detail::precondition_error_handler,char_const(&)[26]>
              (debug_assert::detail::always_false,&local_b0,"","conversion would overflow");
    puVar4 = (ulong *)debug_assert::detail::regular_void::operator_cast_to_long_(&local_99);
    local_160 = *puVar4;
  }
  else {
    local_160 = *local_98;
  }
  local_f0 = local_160;
  local_c8 = local_e0;
  local_d0 = &local_f0;
  local_148 = local_160;
  local_110 = get<type_safe::index_t,type_safe::integer<unsigned_long,type_safe::undefined_behavior_arithmetic>>
                        (&local_138->
                          super_strong_typedef<type_safe::index_t,_type_safe::integer<unsigned_long,_type_safe::undefined_behavior_arithmetic>_>
                        );
  uVar1 = local_110->value_;
  local_78 = &local_120;
  local_120 = uVar1;
  local_100 = local_110;
  uVar3 = std::numeric_limits<long>::max();
  if (uVar3 < uVar1) {
    local_90 = 
    "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/include/type_safe/integer.hpp"
    ;
    local_88 = 0x167;
    debug_assert::detail::
    do_assert<bool()noexcept,type_safe::detail::precondition_error_handler,char_const(&)[26]>
              (debug_assert::detail::always_false,&local_90,"","conversion would overflow");
    puVar4 = (ulong *)debug_assert::detail::regular_void::operator_cast_to_long_(&local_79);
    local_178 = *puVar4;
  }
  else {
    local_178 = *local_78;
  }
  local_118 = local_178;
  local_b8 = local_108;
  local_c0 = &local_118;
  local_150 = local_178;
  local_60 = &local_148;
  local_68 = &local_150;
  local_10 = local_148;
  local_18 = local_178;
  local_50 = local_68;
  local_48 = local_60;
  bVar2 = detail::will_subtraction_error<long>(local_148,local_178);
  if (bVar2) {
    local_30 = 
    "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/include/type_safe/arithmetic_policy.hpp"
    ;
    local_28 = 0x9a;
    debug_assert::detail::
    do_assert<bool()noexcept,type_safe::detail::precondition_error_handler,char_const(&)[37]>
              (debug_assert::detail::always_false,&local_30,"",
               "subtraction will result in underflow");
    plVar5 = debug_assert::detail::regular_void::operator_cast_to_long_(&local_19);
    local_190.value_ = *plVar5;
  }
  else {
    local_190.value_ = local_10 - local_18;
  }
  local_70 = local_190.value_;
  local_38 = local_58;
  local_40 = &local_70;
  local_140 = local_190.value_;
  difference_t::difference_t<long,type_safe::undefined_behavior_arithmetic,void>
            ((difference_t *)&lhs_local,local_190);
  return (strong_typedef<type_safe::difference_t,_type_safe::integer<long,_type_safe::undefined_behavior_arithmetic>_>
          )(strong_typedef<type_safe::difference_t,_type_safe::integer<long,_type_safe::undefined_behavior_arithmetic>_>
            )lhs_local;
}

Assistant:

constexpr difference_t operator-(const index_t& lhs, const index_t& rhs) noexcept
{
    return difference_t(make_signed(get(lhs)) - make_signed(get(rhs)));
}